

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

uint __thiscall base_uint<256U>::bits(base_uint<256U> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  uVar3 = 0x100;
  for (uVar1 = 7; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    if (this->pn[uVar1] != 0) {
      uVar2 = uVar3;
      uVar4 = 0x1f;
      goto LAB_0062da57;
    }
    uVar3 = uVar3 - 0x20;
  }
  uVar2 = 0;
LAB_0062da6c:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar2;
  }
  __stack_chk_fail();
LAB_0062da57:
  if (uVar4 == 0) goto LAB_0062da67;
  if ((this->pn[uVar1] >> (uVar4 & 0x1f) & 1) != 0) goto LAB_0062da6c;
  uVar2 = uVar2 - 1;
  uVar4 = uVar4 - 1;
  goto LAB_0062da57;
LAB_0062da67:
  uVar2 = uVar3 - 0x1f;
  goto LAB_0062da6c;
}

Assistant:

unsigned int base_uint<BITS>::bits() const
{
    for (int pos = WIDTH - 1; pos >= 0; pos--) {
        if (pn[pos]) {
            for (int nbits = 31; nbits > 0; nbits--) {
                if (pn[pos] & 1U << nbits)
                    return 32 * pos + nbits + 1;
            }
            return 32 * pos + 1;
        }
    }
    return 0;
}